

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O1

void __thiscall
bssl::gtest_suite_PkitsTest15DeltaCRLs_::
Section15InvaliddeltaCRLTest3<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::
~Section15InvaliddeltaCRLTest3
          (Section15InvaliddeltaCRLTest3<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest15DeltaCRLs, Section15InvaliddeltaCRLTest3) {
  const char* const certs[] = {"TrustAnchorRootCertificate", "deltaCRLCA1Cert",
                               "InvaliddeltaCRLTest3EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "deltaCRLCA1CRL",
                              "deltaCRLCA1deltaCRL"};
  PkitsTestInfo info;
  info.test_number = "4.15.3";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}